

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuRGBA.cpp
# Opt level: O2

Vec4 __thiscall tcu::RGBA::toVec(RGBA *this)

{
  uint uVar1;
  undefined1 (*in_RDI) [16];
  undefined1 auVar2 [16];
  Vec4 VVar3;
  
  uVar1 = this->m_value;
  auVar2._0_4_ = (float)(uVar1 & 0xff);
  auVar2._4_4_ = (float)(uVar1 >> 8 & 0xff);
  auVar2._8_4_ = (float)(uVar1 >> 0x10 & 0xff);
  auVar2._12_4_ = (float)(uVar1 >> 0x18);
  auVar2 = divps(auVar2,_DAT_016f3560);
  *in_RDI = auVar2;
  VVar3.m_data._0_8_ = auVar2._0_8_;
  VVar3.m_data[2] = (float)(uVar1 >> 0x10);
  VVar3.m_data[3] = 0.0;
  return (Vec4)VVar3.m_data;
}

Assistant:

Vec4 RGBA::toVec (void) const
{
	return Vec4(float(getRed())		/ 255.0f,
				float(getGreen())	/ 255.0f,
				float(getBlue())	/ 255.0f,
				float(getAlpha())	/ 255.0f);
}